

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

int Gia_ObjSimRsb(Gia_SimRsbMan_t *p,int iObj,int nCands,int fVerbose,int *pnBufs,int *pnInvs)

{
  int iVar1;
  word *pwVar2;
  word *pwVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  word *pwVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int local_4c;
  
  pVVar6 = Gia_SimRsbTfo(p,iObj,-1);
  pwVar7 = Gia_SimRsbCareSet(p,iObj,pVVar6);
  uVar4 = p->nWords * iObj;
  if ((-1 < (int)uVar4) && ((int)uVar4 < p->vSimsObj->nSize)) {
    pwVar2 = p->vSimsObj->pArray;
    pVVar6 = Gia_ObjSimCands(p,iObj,nCands);
    iVar1 = p->nWords;
    lVar8 = (long)iVar1;
    if (0 < lVar8) {
      pwVar3 = p->pFunc[0];
      lVar10 = 0;
      do {
        pwVar3[lVar10] = ~pwVar2[(ulong)uVar4 + lVar10] & pwVar7[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar8 != lVar10);
    }
    if (0 < iVar1) {
      pwVar3 = p->pFunc[1];
      lVar10 = 0;
      do {
        pwVar3[lVar10] = pwVar2[(ulong)uVar4 + lVar10] & pwVar7[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar8 != lVar10);
    }
    if (pVVar6->nSize < 1) {
      local_4c = 0;
    }
    else {
      lVar8 = 0;
      local_4c = 0;
      do {
        uVar4 = pVVar6->pArray[lVar8];
        uVar5 = p->nWords;
        uVar9 = uVar5 * uVar4;
        if (((int)uVar9 < 0) || (p->vSimsObj->nSize <= (int)uVar9)) goto LAB_007ca488;
        pwVar7 = p->vSimsObj->pArray;
        if (0 < (int)uVar5) {
          uVar11 = 0;
          do {
            if ((pwVar7[uVar9 + uVar11] & p->pFunc[0][uVar11]) != 0) goto LAB_007ca3de;
            uVar11 = uVar11 + 1;
          } while (uVar5 != uVar11);
        }
        if (0 < (int)uVar5) {
          uVar11 = 0;
          do {
            if ((p->pFunc[1][uVar11] & ~pwVar7[uVar9 + uVar11]) != 0) goto LAB_007ca3de;
            uVar11 = uVar11 + 1;
          } while (uVar5 != uVar11);
        }
        *pnBufs = *pnBufs + 1;
        local_4c = 1;
        if (fVerbose != 0) {
          uVar5 = Gia_ObjLevelId(p->pGia,iObj);
          printf("Level %3d : %d = buf(%d)\n",(ulong)uVar5,(ulong)(uint)iObj,(ulong)uVar4);
        }
LAB_007ca3de:
        lVar10 = (long)p->nWords;
        if (0 < lVar10) {
          lVar12 = 0;
          do {
            if ((p->pFunc[0][lVar12] & ~pwVar7[(ulong)uVar9 + lVar12]) != 0) goto LAB_007ca45b;
            lVar12 = lVar12 + 1;
          } while (lVar10 != lVar12);
        }
        if (0 < p->nWords) {
          lVar12 = 0;
          do {
            if ((pwVar7[(ulong)uVar9 + lVar12] & p->pFunc[1][lVar12]) != 0) goto LAB_007ca45b;
            lVar12 = lVar12 + 1;
          } while (lVar10 != lVar12);
        }
        *pnInvs = *pnInvs + 1;
        local_4c = 1;
        if (fVerbose != 0) {
          uVar5 = Gia_ObjLevelId(p->pGia,iObj);
          printf("Level %3d : %d = inv(%d)\n",(ulong)uVar5,(ulong)(uint)iObj,(ulong)uVar4);
        }
LAB_007ca45b:
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar6->nSize);
    }
    return local_4c;
  }
LAB_007ca488:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

int Gia_ObjSimRsb( Gia_SimRsbMan_t * p, int iObj, int nCands, int fVerbose, int * pnBufs, int * pnInvs )
{
    int i, iCand, RetValue = 0;
    Vec_Int_t * vTfo   = Gia_SimRsbTfo( p, iObj, -1 );
    word * pCareSet    = Gia_SimRsbCareSet( p, iObj, vTfo );
    word * pFunc       = Vec_WrdEntryP( p->vSimsObj, p->nWords*iObj );
    Vec_Int_t * vCands = Gia_ObjSimCands( p, iObj, nCands );
    Abc_TtAndSharp( p->pFunc[0], pCareSet, pFunc, p->nWords, 1 );
    Abc_TtAndSharp( p->pFunc[1], pCareSet, pFunc, p->nWords, 0 );

/*
printf( "Considering node %d with %d candidates:\n", iObj, Vec_IntSize(vCands) );
Vec_IntPrint( vTfo );
Vec_IntPrint( vCands );
Extra_PrintBinary( stdout, (unsigned *)pCareSet,    64 );  printf( "\n" );
Extra_PrintBinary( stdout, (unsigned *)pFunc,       64 );  printf( "\n" );
Extra_PrintBinary( stdout, (unsigned *)p->pFunc[0], 64 );  printf( "\n" );
Extra_PrintBinary( stdout, (unsigned *)p->pFunc[1], 64 );  printf( "\n" );
*/
    Vec_IntForEachEntry( vCands, iCand, i )
    {
        word * pDiv = Vec_WrdEntryP( p->vSimsObj, p->nWords*iCand );
        if ( !Abc_TtIntersect(pDiv, p->pFunc[0], p->nWords, 0) &&
             !Abc_TtIntersect(pDiv, p->pFunc[1], p->nWords, 1) )
            { (*pnBufs)++; if ( fVerbose ) printf( "Level %3d : %d = buf(%d)\n", Gia_ObjLevelId(p->pGia, iObj), iObj, iCand ); RetValue = 1; }
        if ( !Abc_TtIntersect(pDiv, p->pFunc[0], p->nWords, 1) &&
             !Abc_TtIntersect(pDiv, p->pFunc[1], p->nWords, 0) )
            { (*pnInvs)++; if ( fVerbose ) printf( "Level %3d : %d = inv(%d)\n", Gia_ObjLevelId(p->pGia, iObj), iObj, iCand ); RetValue = 1; }
    }
    return RetValue;
}